

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::DeconvolutionDepthWise_x86_avx512::forward
          (DeconvolutionDepthWise_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  pointer pMVar2;
  int *piVar3;
  long *plVar4;
  DeconvolutionDepthWise_x86_avx512 *pDVar5;
  int iVar6;
  ulong uVar7;
  Layer *pLVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  void *pvVar19;
  void *pvVar20;
  int iVar21;
  ParamDict pd;
  ParamDict PStack_228;
  int local_218;
  int local_214;
  DeconvolutionDepthWise_x86_avx512 *local_210;
  ulong local_208;
  int local_200;
  int local_1fc;
  Mat local_1f8;
  long local_1b0;
  Mat local_1a8;
  pointer local_158;
  pointer local_150;
  Option *local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  void *local_138;
  Allocator *local_130;
  ModelBinFromMatArray local_128;
  Mat local_118;
  Mat local_c8;
  void *local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 local_70;
  int local_68;
  Allocator *local_60;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  size_t local_40;
  
  pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar21 = pMVar1->elempack * pMVar1->c;
  local_214 = pMVar1[1].w;
  local_218 = (this->super_DeconvolutionDepthWise).group * pMVar1[1].d;
  iVar6 = pMVar1[1].h;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118.elemsize._4_4_ = 0;
  local_118.elempack = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  local_210 = this;
  local_140 = bottom_blobs;
  flatten(pMVar1 + 1,&local_118,opt);
  iVar9 = -100;
  local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
  local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if ((local_118.data == (void *)0x0) ||
     (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
     local_118.elemsize = CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_118.c * local_118.cstep == 0)) goto LAB_00438f83;
  local_118.w = local_118.w * local_118.elempack;
  local_118.elemsize =
       CONCAT44(local_118.elemsize._4_4_,(undefined4)local_118.elemsize) /
       (ulong)(long)local_118.elempack;
  local_118.elempack = 1;
  local_1a8.cstep = 0;
  uVar12 = iVar6 * local_214;
  local_1a8.data = (Allocator *)0x0;
  local_1a8.refcount._0_4_ = 0;
  local_1a8.refcount._4_4_ = 0;
  local_1a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1a8.elempack = 0;
  local_200 = iVar6;
  local_1a8.allocator = (Allocator *)local_1a8.data;
  local_1a8.dims = (int)local_1a8.refcount;
  local_1a8.w = local_1a8.refcount._4_4_;
  local_1a8._48_8_ = local_1a8.elemsize;
  local_1a8.c = local_1a8.elempack;
  Mat::create(&local_1a8,
              (int)(uVar12 * iVar21 * local_218) / (local_210->super_DeconvolutionDepthWise).group,4
              ,opt->workspace_allocator);
  pDVar5 = local_210;
  iVar9 = -100;
  local_130 = (Allocator *)local_1a8.data;
  local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
  local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
  if (((Allocator *)local_1a8.data != (Allocator *)0x0) &&
     (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
     local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
     (long)local_1a8.c * local_1a8.cstep != 0)) {
    iVar6 = (local_210->super_DeconvolutionDepthWise).group;
    local_1b0 = (long)iVar6;
    if (0 < local_1b0) {
      uVar11 = (long)iVar21 / (long)iVar6;
      uVar10 = uVar11 & 0xffffffff;
      uVar7 = (long)local_218 / (long)iVar6 & 0xffffffff;
      local_138 = local_118.data;
      uVar16 = (ulong)uVar12;
      iVar6 = (int)((long)local_218 / (long)iVar6);
      iVar9 = (int)uVar11;
      local_1fc = iVar6 * uVar12 * iVar9;
      local_208 = 0;
      lVar18 = 0;
      do {
        if (0 < iVar6) {
          pvVar15 = (void *)((long)(_func_int ***)local_1a8.data + (long)(int)local_208 * 4);
          pvVar14 = (void *)((long)local_118.data + (long)(int)local_208 * 4);
          uVar11 = 0;
          do {
            if (0 < iVar9) {
              uVar17 = 0;
              pvVar19 = pvVar14;
              pvVar20 = pvVar15;
              do {
                if (0 < (int)uVar12) {
                  uVar13 = 0;
                  do {
                    *(undefined4 *)((long)pvVar20 + uVar13 * 4) =
                         *(undefined4 *)((long)pvVar19 + uVar13 * 4);
                    uVar13 = uVar13 + 1;
                  } while (uVar16 != uVar13);
                }
                uVar17 = uVar17 + 1;
                pvVar20 = (void *)((long)pvVar20 + uVar16 * 4);
                pvVar19 = (void *)((long)pvVar19 + uVar7 * uVar16 * 4);
              } while (uVar17 != uVar10);
            }
            uVar11 = uVar11 + 1;
            pvVar15 = (void *)((long)pvVar15 + uVar10 * uVar16 * 4);
            pvVar14 = (void *)((long)pvVar14 + uVar16 * 4);
          } while (uVar11 != uVar7);
        }
        lVar18 = lVar18 + 1;
        local_208 = (ulong)(uint)((int)local_208 + local_1fc);
      } while (lVar18 != local_1b0);
    }
    local_1f8.cstep = 0;
    local_1f8.data = (void *)0x0;
    local_1f8.refcount._0_4_ = 0;
    local_1f8.refcount._4_4_ = 0;
    local_1f8.elemsize._0_4_ = 0;
    local_1f8.elemsize._4_4_ = 0;
    local_1f8.elemsize = 0;
    local_1f8.elempack = 0;
    local_1f8.allocator = (Allocator *)0x0;
    local_1f8.dims = 0;
    local_1f8.w = 0;
    local_1f8.h = 0;
    local_1f8.d = 0;
    local_1f8.c = 0;
    local_158 = pMVar2;
    local_150 = pMVar1;
    local_148 = opt;
    if ((local_210->super_DeconvolutionDepthWise).bias_term == 0) {
LAB_00438ac1:
      pLVar8 = create_layer_cpu(0x33);
      ParamDict::ParamDict(&PStack_228);
      ParamDict::set(&PStack_228,0,local_218);
      ParamDict::set(&PStack_228,1,local_214);
      ParamDict::set(&PStack_228,0xb,local_200);
      ParamDict::set(&PStack_228,2,(pDVar5->super_DeconvolutionDepthWise).dilation_w);
      ParamDict::set(&PStack_228,0xc,(pDVar5->super_DeconvolutionDepthWise).dilation_h);
      ParamDict::set(&PStack_228,3,(pDVar5->super_DeconvolutionDepthWise).stride_w);
      ParamDict::set(&PStack_228,0xd,(pDVar5->super_DeconvolutionDepthWise).stride_h);
      ParamDict::set(&PStack_228,4,(pDVar5->super_DeconvolutionDepthWise).pad_left);
      ParamDict::set(&PStack_228,0xf,(pDVar5->super_DeconvolutionDepthWise).pad_right);
      ParamDict::set(&PStack_228,0xe,(pDVar5->super_DeconvolutionDepthWise).pad_top);
      ParamDict::set(&PStack_228,0x10,(pDVar5->super_DeconvolutionDepthWise).pad_bottom);
      ParamDict::set(&PStack_228,0x12,(pDVar5->super_DeconvolutionDepthWise).output_pad_right);
      ParamDict::set(&PStack_228,0x13,(pDVar5->super_DeconvolutionDepthWise).output_pad_bottom);
      ParamDict::set(&PStack_228,0x14,(pDVar5->super_DeconvolutionDepthWise).output_w);
      ParamDict::set(&PStack_228,0x15,(pDVar5->super_DeconvolutionDepthWise).output_h);
      ParamDict::set(&PStack_228,5,(pDVar5->super_DeconvolutionDepthWise).bias_term);
      ParamDict::set(&PStack_228,6,local_1a8.w);
      ParamDict::set(&PStack_228,7,(pDVar5->super_DeconvolutionDepthWise).group);
      ParamDict::set(&PStack_228,9,(pDVar5->super_DeconvolutionDepthWise).activation_type);
      ParamDict::set(&PStack_228,10,&(pDVar5->super_DeconvolutionDepthWise).activation_params);
      (*pLVar8->_vptr_Layer[2])(pLVar8,&PStack_228);
      piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_c8.elemsize._0_4_ = (undefined4)local_1a8.elemsize;
      local_c8.elemsize._4_4_ = (undefined4)(local_1a8.elemsize >> 0x20);
      local_c8.h = local_1a8.h;
      local_c8.d = local_1a8.d;
      piVar3 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_c8.cstep = local_1a8.cstep;
      local_c8.c = local_1a8.c;
      local_c8.w = local_1a8.w;
      local_c8.dims = local_1a8.dims;
      local_c8.allocator = local_1a8.allocator;
      local_c8.elempack = local_1a8.elempack;
      local_c8.refcount._4_4_ = local_1a8.refcount._4_4_;
      local_c8.refcount._0_4_ = (int)local_1a8.refcount;
      local_c8.data = local_1a8.data;
      local_70 = local_1f8.elemsize;
      local_80 = local_1f8.data;
      uStack_78 = local_1f8.refcount._0_4_;
      uStack_74 = local_1f8.refcount._4_4_;
      local_68 = local_1f8.elempack;
      local_60 = local_1f8.allocator;
      iStack_58 = local_1f8.dims;
      iStack_54 = local_1f8.w;
      iStack_50 = local_1f8.h;
      iStack_4c = local_1f8.d;
      local_48 = local_1f8.c;
      local_40 = local_1f8.cstep;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_128,&local_c8);
      (*pLVar8->_vptr_Layer[3])(pLVar8,&local_128);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_128);
      (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
      (*pLVar8->_vptr_Layer[7])(pLVar8,pMVar1,pMVar2,opt);
      (*pLVar8->_vptr_Layer[5])(pLVar8,opt);
      (*pLVar8->_vptr_Layer[1])(pLVar8);
      lVar18 = 0x48;
      do {
        piVar3 = *(int **)((long)&local_c8.refcount + lVar18);
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pvVar15 = *(void **)((long)&local_c8.data + lVar18);
            plVar4 = *(long **)((long)&local_c8.allocator + lVar18);
            if (plVar4 == (long *)0x0) {
              if (pvVar15 != (void *)0x0) {
                free(pvVar15);
              }
            }
            else {
              (**(code **)(*plVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&local_c8.cstep + lVar18) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar18 + 4) = 0;
        *(undefined8 *)((long)&local_c8.elemsize + lVar18 + 4) = 0;
        *(undefined8 *)((long)&local_c8.data + lVar18) = 0;
        *(undefined8 *)((long)&local_c8.refcount + lVar18) = 0;
        *(undefined8 *)((long)&local_c8.dims + lVar18) = 0;
        *(undefined8 *)((long)&local_c8.h + lVar18) = 0;
        *(undefined4 *)((long)&local_c8.c + lVar18) = 0;
        lVar18 = lVar18 + -0x48;
      } while (lVar18 != -0x48);
      ParamDict::~ParamDict(&PStack_228);
      iVar9 = 0;
    }
    else {
      flatten((local_140->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_1f8,opt);
      iVar9 = -100;
      local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize);
      local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70);
      if ((local_1f8.data != (void *)0x0) &&
         (local_1f8.elemsize = CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize),
         local_70 = CONCAT44(local_70._4_4_,(undefined4)local_70),
         (long)local_1f8.c * local_1f8.cstep != 0)) {
        local_1f8.w = local_1f8.w * local_1f8.elempack;
        local_1f8.elemsize =
             CONCAT44(local_1f8.elemsize._4_4_,(undefined4)local_1f8.elemsize) /
             (ulong)(long)local_1f8.elempack;
        local_1f8.elempack = 1;
        goto LAB_00438ac1;
      }
    }
    piVar3 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_1f8.allocator == (Allocator *)0x0) {
          if (local_1f8.data != (void *)0x0) {
            free(local_1f8.data);
          }
        }
        else {
          (*(local_1f8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_1a8.refcount._4_4_,(int)local_1a8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1a8.data != (Allocator *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (*(local_1a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00438f83:
  piVar3 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        if (local_118.data != (void *)0x0) {
          free(local_118.data);
        }
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar9;
}

Assistant:

int DeconvolutionDepthWise_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::DeconvolutionDepthWise);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(7, group);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}